

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBinaryReader::ReadTableSection(WasmBinaryReader *this,bool isImportSection)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  uint32 maxInitial;
  undefined7 in_register_00000031;
  WasmBinaryReader *pWVar4;
  FunctionBody *pFVar5;
  SectionLimits local_28;
  uint32 local_1c [2];
  uint32 length;
  
  if ((int)CONCAT71(in_register_00000031,isImportSection) == 0) {
    pWVar4 = this;
    uVar3 = LEB128<unsigned_int,32u>(this,local_1c);
    if (1 < uVar3) {
      ThrowDecodingError(pWVar4,L"Maximum of one table allowed");
    }
    if (uVar3 != 1) {
      return;
    }
  }
  pWVar4 = this;
  cVar1 = LEB128<char,7u>(this,local_1c);
  if (cVar1 == -0x10) {
    maxInitial = DAT_01430308;
    if (DAT_01430302 != '\0') {
      maxInitial = 0xffffffff;
    }
    local_28 = (SectionLimits)
               ReadSectionLimitsBase<Wasm::TableSectionLimits>
                         (this,maxInitial,maxInitial,L"table too big");
    Js::WebAssemblyModule::InitializeTable(this->m_module,(TableSectionLimits *)&local_28);
    pFVar5 = (this->m_funcState).body;
    if (pFVar5 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
    }
    else {
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
      if (this->m_readerState == READER_STATE_FUNCTION) {
        pFVar5 = (this->m_funcState).body;
      }
      else {
        pFVar5 = (FunctionBody *)0x0;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
    }
    if (bVar2 != false) {
      Output::Print(L"Indirect table: %u to %u entries",(ulong)local_28.initial,
                    (ulong)local_28.maximum);
      Output::Print(L"\n");
      Output::Flush();
    }
    return;
  }
  ThrowDecodingError(pWVar4,L"Only anyfunc type is supported. Unknown type %d",
                     (ulong)(uint)(int)cVar1);
}

Assistant:

void WasmBinaryReader::ReadTableSection(bool isImportSection)
{
    uint32 length;
    uint32 entries;
    if (isImportSection)
    {
        entries = 1;
    }
    else
    {
        entries = LEB128(length);
    }
    if (entries > 1)
    {
        ThrowDecodingError(_u("Maximum of one table allowed"));
    }

    if (entries == 1)
    {
        int8 elementType = SLEB128<int8, 7>(length);
        if (elementType != LanguageTypes::anyfunc)
        {
            ThrowDecodingError(_u("Only anyfunc type is supported. Unknown type %d"), elementType);
        }
        TableSectionLimits limits = ReadSectionLimitsBase<TableSectionLimits>(Limits::GetMaxTableSize(), Limits::GetMaxTableSize(), _u("table too big"));
        m_module->InitializeTable(&limits);
        TRACE_WASM_DECODER(_u("Indirect table: %u to %u entries"), limits.initial, limits.maximum);
    }
}